

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O3

void canvas_destroy_editor(_glist *x)

{
  t_editor *fatso;
  
  glist_noselect(x);
  fatso = x->gl_editor;
  if (fatso != (t_editor *)0x0) {
    if (fatso->e_textedfor == (_rtext *)0x0) goto LAB_0013f238;
    rtext_activate(fatso->e_textedfor,0);
    while( true ) {
      fatso = x->gl_editor;
LAB_0013f238:
      if (fatso->e_rtext == (_rtext *)0x0) break;
      rtext_free(fatso->e_rtext);
    }
    glist_noselect(x);
    guiconnect_notarget(fatso->e_guiconnect,1000.0);
    binbuf_free(fatso->e_connectbuf);
    binbuf_free(fatso->e_deleted);
    if (fatso->e_clock != (_clock *)0x0) {
      clock_free(fatso->e_clock);
    }
    freebytes(fatso,0xa0);
    x->gl_editor = (t_editor *)0x0;
  }
  return;
}

Assistant:

void canvas_destroy_editor(t_glist *x)
{
    glist_noselect(x);
    if (x->gl_editor)
    {
        t_rtext *rtext;
            /* this happens if we had activated an atom box in run mode: */
        if (x->gl_editor->e_textedfor)
            rtext_activate(x->gl_editor->e_textedfor, 0);
        while ((rtext = x->gl_editor->e_rtext))
            rtext_free(rtext);
        editor_free(x->gl_editor, x);
        x->gl_editor = 0;
    }
}